

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  stbi_uc sVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  short sVar7;
  bool bVar8;
  int *piVar9;
  byte bVar10;
  char cVar11;
  uchar uVar12;
  int iVar13;
  stbi__uint32 sVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  stbi__jpeg *z;
  long lVar20;
  byte *pbVar21;
  void *pvVar22;
  code *pcVar23;
  void *pvVar24;
  undefined8 *puVar25;
  int iVar26;
  char *pcVar27;
  undefined8 *puVar28;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar29;
  int iVar30;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  int why_00;
  undefined8 extraout_RDX;
  undefined8 uVar31;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  anon_struct_96_18_0d0905d3 *paVar32;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *extraout_RDX_16;
  stbi_uc *psVar33;
  stbi__context *psVar34;
  stbi_uc **ppsVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  stbi_uc *psVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  short *psVar45;
  long *in_FS_OFFSET;
  bool bVar46;
  undefined1 auVar47 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_1c0;
  uint local_1b4;
  stbi_uc *local_148 [3];
  long lStack_130;
  int *local_120;
  stbi__uint32 *local_118;
  stbi__uint32 *local_110;
  int *local_108;
  long local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -8) = "outofmem";
    return (void *)0x0;
  }
  local_118 = (stbi__uint32 *)x;
  local_110 = (stbi__uint32 *)y;
  local_108 = comp;
  memset(z,0,0x4888);
  z->s = s;
  z->idct_block_kernel = stbi__idct_simd;
  z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  paVar1 = z->img_comp;
  lVar20 = 0x46d8;
  do {
    psVar33 = z->huff_dc[0].fast + lVar20 + -8;
    psVar33[0] = '\0';
    psVar33[1] = '\0';
    psVar33[2] = '\0';
    psVar33[3] = '\0';
    psVar33[4] = '\0';
    psVar33[5] = '\0';
    psVar33[6] = '\0';
    psVar33[7] = '\0';
    psVar33[8] = '\0';
    psVar33[9] = '\0';
    psVar33[10] = '\0';
    psVar33[0xb] = '\0';
    psVar33[0xc] = '\0';
    psVar33[0xd] = '\0';
    psVar33[0xe] = '\0';
    psVar33[0xf] = '\0';
    lVar20 = lVar20 + 0x60;
  } while (lVar20 != 0x4858);
  z->restart_interval = 0;
  iVar13 = stbi__decode_jpeg_header(z,0);
  uVar19 = extraout_EDX;
  if (iVar13 == 0) {
LAB_0045c802:
    uVar37 = z->s->img_n;
LAB_0045c80c:
    stbi__free_jpeg_components(z,uVar37,uVar19);
  }
  else {
    bVar10 = stbi__get_marker(z);
    uVar37 = (uint)bVar10;
    puVar25 = (undefined8 *)(*in_FS_OFFSET + -8);
    local_120 = z->huff_ac[0].delta + 9;
    uVar31 = extraout_RDX;
LAB_0045a9ed:
    uVar19 = (uint)uVar31;
    if (uVar37 == 0xda) {
      iVar13 = stbi__get16be(z->s);
      psVar34 = z->s;
      pbVar21 = psVar34->img_buffer;
      paVar32 = extraout_RDX_03;
      if (pbVar21 < psVar34->img_buffer_end) {
LAB_0045ab2a:
        psVar34->img_buffer = pbVar21 + 1;
        bVar10 = *pbVar21;
      }
      else {
        if (psVar34->read_from_callbacks != 0) {
          psVar33 = psVar34->buffer_start;
          iVar18 = (*(psVar34->io).read)(psVar34->io_user_data,(char *)psVar33,psVar34->buflen);
          psVar34->callback_already_read =
               psVar34->callback_already_read +
               (*(int *)&psVar34->img_buffer - *(int *)&psVar34->img_buffer_original);
          if (iVar18 == 0) {
            psVar34->read_from_callbacks = 0;
            psVar34->img_buffer = psVar33;
            psVar34->img_buffer_end = psVar34->buffer_start + 1;
            psVar34->buffer_start[0] = '\0';
          }
          else {
            psVar34->img_buffer = psVar33;
            psVar34->img_buffer_end = psVar33 + iVar18;
          }
          pbVar21 = psVar34->img_buffer;
          paVar32 = extraout_RDX_04;
          goto LAB_0045ab2a;
        }
        bVar10 = 0;
      }
      z->scan_n = (uint)bVar10;
      if ((0xfb < (byte)(bVar10 - 5)) && ((int)(uint)bVar10 <= z->s->img_n)) {
        if (iVar13 != (uint)bVar10 * 2 + 6) {
          pcVar27 = "bad SOS len";
          goto LAB_0045c7fa;
        }
        if (bVar10 != 0) {
          lVar20 = 0;
          do {
            psVar34 = z->s;
            pbVar21 = psVar34->img_buffer;
            if (pbVar21 < psVar34->img_buffer_end) {
LAB_0045abfa:
              psVar34->img_buffer = pbVar21 + 1;
              uVar37 = (uint)*pbVar21;
            }
            else {
              if (psVar34->read_from_callbacks != 0) {
                psVar33 = psVar34->buffer_start;
                iVar13 = (*(psVar34->io).read)
                                   (psVar34->io_user_data,(char *)psVar33,psVar34->buflen);
                psVar34->callback_already_read =
                     psVar34->callback_already_read +
                     (*(int *)&psVar34->img_buffer - *(int *)&psVar34->img_buffer_original);
                if (iVar13 == 0) {
                  psVar34->read_from_callbacks = 0;
                  psVar34->img_buffer = psVar33;
                  psVar34->img_buffer_end = psVar34->buffer_start + 1;
                  psVar34->buffer_start[0] = '\0';
                }
                else {
                  psVar34->img_buffer = psVar33;
                  psVar34->img_buffer_end = psVar33 + iVar13;
                }
                pbVar21 = psVar34->img_buffer;
                goto LAB_0045abfa;
              }
              uVar37 = 0;
            }
            psVar34 = z->s;
            pbVar21 = psVar34->img_buffer;
            if (pbVar21 < psVar34->img_buffer_end) {
LAB_0045ac8e:
              psVar34->img_buffer = pbVar21 + 1;
              bVar10 = *pbVar21;
            }
            else {
              if (psVar34->read_from_callbacks != 0) {
                psVar33 = psVar34->buffer_start;
                iVar13 = (*(psVar34->io).read)
                                   (psVar34->io_user_data,(char *)psVar33,psVar34->buflen);
                psVar34->callback_already_read =
                     psVar34->callback_already_read +
                     (*(int *)&psVar34->img_buffer - *(int *)&psVar34->img_buffer_original);
                if (iVar13 == 0) {
                  psVar34->read_from_callbacks = 0;
                  psVar34->img_buffer = psVar33;
                  psVar34->img_buffer_end = psVar34->buffer_start + 1;
                  psVar34->buffer_start[0] = '\0';
                }
                else {
                  psVar34->img_buffer = psVar33;
                  psVar34->img_buffer_end = psVar33 + iVar13;
                }
                pbVar21 = psVar34->img_buffer;
                goto LAB_0045ac8e;
              }
              bVar10 = 0;
            }
            uVar19 = z->s->img_n;
            if ((int)uVar19 < 1) {
              uVar36 = 0;
            }
            else {
              uVar36 = 0;
              paVar32 = paVar1;
              do {
                if (paVar32->id == uVar37) goto LAB_0045acc1;
                uVar36 = uVar36 + 1;
                paVar32 = paVar32 + 1;
              } while (uVar19 != uVar36);
              uVar36 = (ulong)uVar19;
            }
LAB_0045acc1:
            if ((uint)uVar36 == uVar19) goto LAB_0045c802;
            uVar38 = uVar36 & 0xffffffff;
            paVar32 = (anon_struct_96_18_0d0905d3 *)(uVar38 * 0x60);
            z->img_comp[uVar38].hd = (uint)(bVar10 >> 4);
            if (0x3f < bVar10) {
              pcVar27 = "bad DC huff";
              goto LAB_0045c7fa;
            }
            paVar32 = paVar1 + uVar38;
            paVar32->ha = bVar10 & 0xf;
            if (3 < (bVar10 & 0xf)) {
              pcVar27 = "bad AC huff";
              goto LAB_0045c7fa;
            }
            z->order[lVar20] = (uint)uVar36;
            lVar20 = lVar20 + 1;
          } while (lVar20 < z->scan_n);
        }
        psVar34 = z->s;
        pbVar21 = psVar34->img_buffer;
        if (pbVar21 < psVar34->img_buffer_end) {
LAB_0045ad9c:
          psVar34->img_buffer = pbVar21 + 1;
          uVar19 = (uint)*pbVar21;
        }
        else {
          if (psVar34->read_from_callbacks != 0) {
            psVar33 = psVar34->buffer_start;
            iVar13 = (*(psVar34->io).read)(psVar34->io_user_data,(char *)psVar33,psVar34->buflen);
            psVar34->callback_already_read =
                 psVar34->callback_already_read +
                 (*(int *)&psVar34->img_buffer - *(int *)&psVar34->img_buffer_original);
            if (iVar13 == 0) {
              psVar34->read_from_callbacks = 0;
              psVar34->img_buffer = psVar33;
              psVar34->img_buffer_end = psVar34->buffer_start + 1;
              psVar34->buffer_start[0] = '\0';
            }
            else {
              psVar34->img_buffer = psVar33;
              psVar34->img_buffer_end = psVar33 + iVar13;
            }
            pbVar21 = psVar34->img_buffer;
            goto LAB_0045ad9c;
          }
          uVar19 = 0;
        }
        z->spec_start = uVar19;
        psVar34 = z->s;
        pbVar21 = psVar34->img_buffer;
        if (pbVar21 < psVar34->img_buffer_end) {
LAB_0045ae37:
          psVar34->img_buffer = pbVar21 + 1;
          uVar19 = (uint)*pbVar21;
        }
        else {
          if (psVar34->read_from_callbacks != 0) {
            psVar33 = psVar34->buffer_start;
            iVar13 = (*(psVar34->io).read)(psVar34->io_user_data,(char *)psVar33,psVar34->buflen);
            psVar34->callback_already_read =
                 psVar34->callback_already_read +
                 (*(int *)&psVar34->img_buffer - *(int *)&psVar34->img_buffer_original);
            if (iVar13 == 0) {
              psVar34->read_from_callbacks = 0;
              psVar34->img_buffer = psVar33;
              psVar34->img_buffer_end = psVar34->buffer_start + 1;
              psVar34->buffer_start[0] = '\0';
            }
            else {
              psVar34->img_buffer = psVar33;
              psVar34->img_buffer_end = psVar33 + iVar13;
            }
            pbVar21 = psVar34->img_buffer;
            goto LAB_0045ae37;
          }
          uVar19 = 0;
        }
        z->spec_end = uVar19;
        psVar34 = z->s;
        pbVar21 = psVar34->img_buffer;
        if (pbVar21 < psVar34->img_buffer_end) {
LAB_0045aed2:
          psVar34->img_buffer = pbVar21 + 1;
          bVar10 = *pbVar21;
        }
        else {
          if (psVar34->read_from_callbacks != 0) {
            psVar33 = psVar34->buffer_start;
            iVar13 = (*(psVar34->io).read)(psVar34->io_user_data,(char *)psVar33,psVar34->buflen);
            psVar34->callback_already_read =
                 psVar34->callback_already_read +
                 (*(int *)&psVar34->img_buffer - *(int *)&psVar34->img_buffer_original);
            if (iVar13 == 0) {
              psVar34->read_from_callbacks = 0;
              psVar34->img_buffer = psVar33;
              psVar34->img_buffer_end = psVar34->buffer_start + 1;
              psVar34->buffer_start[0] = '\0';
            }
            else {
              psVar34->img_buffer = psVar33;
              psVar34->img_buffer_end = psVar33 + iVar13;
            }
            pbVar21 = psVar34->img_buffer;
            goto LAB_0045aed2;
          }
          bVar10 = 0;
        }
        z->succ_high = (uint)(bVar10 >> 4);
        uVar19 = bVar10 & 0xf;
        paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar19;
        z->succ_low = uVar19;
        iVar13 = z->progressive;
        iVar18 = z->spec_start;
        if (iVar13 == 0) {
          if ((iVar18 != 0) || ((0xf < bVar10 || ((bVar10 & 0xf) != 0)))) {
LAB_0045c1e5:
            pcVar27 = "bad SOS";
            goto LAB_0045c7fa;
          }
          z->spec_end = 0x3f;
        }
        else if ((((0x3f < iVar18) || (0x3f < z->spec_end)) || (z->spec_end < iVar18)) ||
                ((0xdf < bVar10 || (0xd < uVar19)))) goto LAB_0045c1e5;
        iVar18 = z->scan_n;
        uVar36 = (ulong)(uint)z->restart_interval;
        if (z->restart_interval == 0) {
          uVar36 = 0x7fffffff;
        }
        z->code_buffer = 0;
        z->code_bits = 0;
        z->nomore = 0;
        z->img_comp[3].dc_pred = 0;
        z->img_comp[2].dc_pred = 0;
        z->img_comp[1].dc_pred = 0;
        z->img_comp[0].dc_pred = 0;
        z->marker = 0xff;
        uVar19 = (uint)uVar36;
        z->todo = uVar19;
        z->eob_run = 0;
        if (iVar13 == 0) {
          if (iVar18 == 1) {
            iVar13 = z->order[0];
            local_1b4 = z->img_comp[iVar13].y + 7 >> 3;
            uVar38 = 1;
            if (0 < (int)local_1b4) {
              uVar37 = paVar1[iVar13].x + 7 >> 3;
              iVar18 = 0;
              uVar29 = 0;
              do {
                if (0 < (int)uVar37) {
                  lVar20 = 0;
                  do {
                    iVar15 = stbi__jpeg_decode_block
                                       (z,local_f8,z->huff_dc + paVar1[iVar13].hd,
                                        z->huff_ac + paVar1[iVar13].ha,z->fast_ac[paVar1[iVar13].ha]
                                        ,iVar13,z->dequant[paVar1[iVar13].tq]);
                    if (iVar15 == 0) {
                      bVar46 = false;
                      local_1c0 = 0;
                      uVar36 = extraout_RDX_07;
                    }
                    else {
                      (*z->idct_block_kernel)
                                (paVar1[iVar13].data + lVar20 + iVar18 * paVar1[iVar13].w2,
                                 paVar1[iVar13].w2,local_f8);
                      iVar15 = z->todo;
                      z->todo = iVar15 + -1;
                      bVar46 = true;
                      uVar36 = extraout_RDX_08;
                      if (iVar15 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar36 = extraout_RDX_09;
                        }
                        if ((z->marker & 0xf8) == 0xd0) {
                          z->code_buffer = 0;
                          z->code_bits = 0;
                          z->nomore = 0;
                          z->img_comp[3].dc_pred = 0;
                          z->img_comp[2].dc_pred = 0;
                          z->img_comp[1].dc_pred = 0;
                          z->img_comp[0].dc_pred = 0;
                          z->marker = 0xff;
                          iVar15 = z->restart_interval;
                          uVar36 = 0x7fffffff;
                          if (iVar15 == 0) {
                            iVar15 = 0x7fffffff;
                          }
                          z->todo = iVar15;
                          z->eob_run = 0;
                        }
                        else {
                          local_1c0 = 1;
                          bVar46 = false;
                        }
                      }
                    }
                    uVar19 = (uint)uVar36;
                    if (!bVar46) {
                      uVar38 = local_1c0 & 0xffffffff;
                      goto LAB_0045bfa9;
                    }
                    lVar20 = lVar20 + 8;
                  } while ((ulong)uVar37 * 8 - lVar20 != 0);
                }
                uVar19 = (uint)uVar36;
                uVar29 = uVar29 + 1;
                iVar18 = iVar18 + 8;
              } while (uVar29 != local_1b4);
              goto LAB_0045bd32;
            }
          }
          else {
            uVar38 = 1;
            if (0 < z->img_mcu_y) {
              iVar13 = 0;
              do {
                if (0 < z->img_mcu_x) {
                  iVar18 = 0;
                  do {
                    if (0 < z->scan_n) {
                      lVar20 = 0;
                      do {
                        iVar15 = z->order[lVar20];
                        local_1c0 = (ulong)iVar15;
                        if (0 < z->img_comp[local_1c0].v) {
                          iVar26 = 0;
                          bVar46 = true;
                          do {
                            local_1b4 = CONCAT31(local_1b4._1_3_,bVar46);
                            iVar16 = paVar1[local_1c0].h;
                            if (0 < iVar16) {
                              iVar30 = 0;
                              do {
                                iVar6 = paVar1[local_1c0].v;
                                iVar17 = stbi__jpeg_decode_block
                                                   (z,local_f8,z->huff_dc + paVar1[local_1c0].hd,
                                                    z->huff_ac + paVar1[local_1c0].ha,
                                                    z->fast_ac[paVar1[local_1c0].ha],iVar15,
                                                    z->dequant[paVar1[local_1c0].tq]);
                                uVar19 = (uint)extraout_RDX_11;
                                if (iVar17 == 0) {
                                  uVar36 = extraout_RDX_11;
                                  if (bVar46 != false) goto LAB_0045bf7f;
                                  goto LAB_0045be90;
                                }
                                (*z->idct_block_kernel)
                                          (paVar1[local_1c0].data +
                                           (long)((iVar16 * iVar18 + iVar30) * 8) +
                                           (long)((iVar6 * iVar13 + iVar26) * paVar1[local_1c0].w2 *
                                                 8),paVar1[local_1c0].w2,local_f8);
                                iVar30 = iVar30 + 1;
                                iVar16 = paVar1[local_1c0].h;
                                uVar36 = extraout_RDX_12;
                              } while (iVar30 < iVar16);
                            }
                            iVar26 = iVar26 + 1;
                            bVar46 = iVar26 < paVar1[local_1c0].v;
                          } while (iVar26 < paVar1[local_1c0].v);
                        }
LAB_0045be90:
                        lVar20 = lVar20 + 1;
                      } while (lVar20 < z->scan_n);
                    }
                    uVar19 = (uint)uVar36;
                    iVar15 = z->todo;
                    z->todo = iVar15 + -1;
                    uVar38 = 1;
                    if (iVar15 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar19 = extraout_EDX_02;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_0045bfa9;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar15 = z->restart_interval;
                      uVar36 = 0x7fffffff;
                      if (iVar15 == 0) {
                        iVar15 = 0x7fffffff;
                      }
                      z->todo = iVar15;
                      z->eob_run = 0;
                    }
                    iVar18 = iVar18 + 1;
                  } while (iVar18 < z->img_mcu_x);
                }
                uVar19 = (uint)uVar36;
                uVar38 = 1;
                iVar13 = iVar13 + 1;
              } while (iVar13 < z->img_mcu_y);
            }
          }
        }
        else if (iVar18 == 1) {
          lVar20 = (long)z->order[0];
          iVar13 = z->img_comp[lVar20].y + 7 >> 3;
          uVar38 = 1;
          local_100 = lVar20;
          if (0 < iVar13) {
            iVar15 = z->img_comp[lVar20].x + 7 >> 3;
            iVar18 = 0;
            do {
              if (0 < iVar15) {
                iVar26 = 0;
                do {
                  piVar9 = local_120;
                  psVar45 = paVar1[lVar20].coeff + (paVar1[lVar20].coeff_w * iVar18 + iVar26) * 0x40
                  ;
                  uVar38 = (ulong)z->spec_start;
                  if (uVar38 == 0) {
                    iVar16 = stbi__jpeg_decode_block_prog_dc
                                       (z,psVar45,z->huff_dc + paVar1[lVar20].hd,(int)local_100);
                    uVar36 = extraout_RDX_05;
                    if (iVar16 != 0) goto LAB_0045b52f;
                    bVar46 = false;
                    local_1b4 = 0;
                  }
                  else {
                    lVar39 = (long)paVar1[lVar20].ha;
                    iVar16 = z->eob_run;
                    bVar10 = (byte)z->succ_low;
                    if (z->succ_high == 0) {
                      if (iVar16 == 0) {
                        local_1c0 = (ulong)(uint)z->succ_low;
                        do {
                          if (z->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(z);
                          }
                          sVar4 = z->fast_ac[lVar39][z->code_buffer >> 0x17];
                          uVar19 = (uint)sVar4;
                          iVar16 = (int)uVar38;
                          if (sVar4 == 0) {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            uVar19 = z->code_buffer;
                            uVar36 = (ulong)z->huff_ac[lVar39].fast[uVar19 >> 0x17];
                            if (uVar36 == 0xff) {
                              lVar42 = 0;
                              do {
                                lVar40 = lVar42;
                                lVar42 = lVar40 + 1;
                              } while ((uint)piVar9[lVar39 * 0x1a4 + lVar40 + -0x11] <=
                                       uVar19 >> 0x10);
                              iVar30 = z->code_bits;
                              if (lVar42 == 8) {
                                z->code_bits = iVar30 + -0x10;
                                uVar43 = 0xffffffff;
                              }
                              else {
                                uVar43 = 0xffffffff;
                                if (((int)(lVar40 + 10) <= iVar30) &&
                                   (uVar37 = (uVar19 >> (0x17U - (char)lVar42 & 0x1f) &
                                             stbi__bmask[lVar40 + 10]) +
                                             piVar9[lVar39 * 0x1a4 + lVar42], uVar37 < 0x100)) {
                                  bVar2 = z->huff_ac[lVar39].size[uVar37];
                                  if ((uVar19 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                      (uint)z->huff_ac[lVar39].code[uVar37]) goto LAB_0045c8b2;
                                  z->code_bits = (iVar30 - (int)lVar42) + -9;
                                  z->code_buffer = uVar19 << ((byte)(lVar40 + 10) & 0x1f);
                                  uVar43 = (ulong)z->huff_ac[lVar39].values[uVar37];
                                }
                              }
                            }
                            else {
                              bVar2 = z->huff_ac[lVar39].size[uVar36];
                              uVar43 = 0xffffffff;
                              if ((int)(uint)bVar2 <= z->code_bits) {
                                z->code_buffer = uVar19 << (bVar2 & 0x1f);
                                z->code_bits = z->code_bits - (uint)bVar2;
                                uVar43 = (ulong)z->huff_ac[lVar39].values[uVar36];
                              }
                            }
                            uVar19 = (uint)uVar43;
                            if ((int)uVar19 < 0) {
                              *puVar25 = "bad huffman code";
                              iVar16 = 1;
                              bVar46 = false;
                            }
                            else {
                              uVar36 = uVar43 >> 4;
                              uVar37 = uVar19 & 0xf;
                              iVar30 = (int)uVar36;
                              if ((uVar43 & 0xf) == 0) {
                                if (uVar19 < 0xf0) {
                                  z->eob_run = 1 << ((byte)uVar36 & 0x1f);
                                  if (0xf < uVar19) {
                                    if (z->code_bits < iVar30) {
                                      stbi__grow_buffer_unsafe(z);
                                    }
                                    uVar19 = 0;
                                    if (iVar30 <= z->code_bits) {
                                      bVar2 = (byte)uVar36 & 0x1f;
                                      uVar19 = z->code_buffer << bVar2 |
                                               z->code_buffer >> 0x20 - bVar2;
                                      uVar37 = stbi__bmask[uVar36];
                                      z->code_buffer = ~uVar37 & uVar19;
                                      uVar19 = uVar19 & uVar37;
                                      z->code_bits = z->code_bits - iVar30;
                                    }
                                    z->eob_run = z->eob_run + uVar19;
                                  }
                                  z->eob_run = z->eob_run + -1;
                                  iVar16 = 2;
                                  goto LAB_0045b68a;
                                }
                                uVar19 = iVar16 + 0x10;
                              }
                              else {
                                bVar2 = ""[(long)iVar16 + uVar36];
                                if (z->code_bits < (int)uVar37) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                iVar30 = 0;
                                if ((int)uVar37 <= z->code_bits) {
                                  uVar19 = z->code_buffer;
                                  uVar44 = uVar19 << (sbyte)uVar37 | uVar19 >> 0x20 - (sbyte)uVar37;
                                  uVar29 = *(uint *)((long)stbi__bmask + (ulong)(uVar37 << 2));
                                  z->code_buffer = ~uVar29 & uVar44;
                                  z->code_bits = z->code_bits - uVar37;
                                  iVar30 = 0;
                                  if (-1 < (int)uVar19) {
                                    iVar30 = *(int *)((long)stbi__jbias + (ulong)(uVar37 << 2));
                                  }
                                  iVar30 = (uVar44 & uVar29) + iVar30;
                                }
                                uVar19 = (int)((long)iVar16 + uVar36) + 1;
                                psVar45[bVar2] = (short)(iVar30 << (bVar10 & 0x1f));
                              }
                              uVar38 = (ulong)uVar19;
                              iVar16 = 0;
                              bVar46 = true;
                            }
                          }
                          else {
                            uVar29 = iVar16 + (uVar19 >> 4 & 0xf);
                            uVar38 = (ulong)uVar29;
                            uVar37 = uVar19 & 0xf;
                            if (z->code_bits < (int)uVar37) {
                              *puVar25 = "bad huffman code";
                              iVar16 = 1;
LAB_0045b68a:
                              bVar46 = false;
                            }
                            else {
                              z->code_buffer = z->code_buffer << (sbyte)uVar37;
                              z->code_bits = z->code_bits - uVar37;
                              uVar38 = (ulong)(uVar29 + 1);
                              psVar45[""[(int)uVar29]] = (short)((uVar19 >> 8) << (bVar10 & 0x1f));
                              iVar16 = 0 << (bVar10 & 0x1f);
                              bVar46 = true;
                            }
                          }
                          uVar36 = 0;
                          bVar8 = true;
                          if (iVar16 != 0) {
                            if (iVar16 != 2) {
                              bVar8 = bVar46;
                            }
                            break;
                          }
                        } while ((int)uVar38 <= z->spec_end);
                      }
                      else {
                        z->eob_run = iVar16 + -1;
                        uVar36 = 1;
                        bVar8 = false;
                      }
                      if (bVar8) goto LAB_0045b505;
                    }
                    else {
                      if (iVar16 == 0) {
                        iVar16 = 0x10000 << (bVar10 & 0x1f);
                        uVar19 = iVar16 >> 0x10;
                        do {
                          if (z->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(z);
                          }
                          uVar37 = z->code_buffer;
                          uVar36 = (ulong)z->huff_ac[lVar39].fast[uVar37 >> 0x17];
                          if (uVar36 == 0xff) {
                            lVar42 = 0;
                            do {
                              lVar40 = lVar42;
                              lVar42 = lVar40 + 1;
                            } while ((uint)piVar9[lVar39 * 0x1a4 + lVar40 + -0x11] <= uVar37 >> 0x10
                                    );
                            iVar30 = z->code_bits;
                            if (lVar42 == 8) {
                              z->code_bits = iVar30 + -0x10;
                              uVar29 = 0xffffffff;
                            }
                            else {
                              uVar29 = 0xffffffff;
                              if (((int)(lVar40 + 10) <= iVar30) &&
                                 (uVar44 = (uVar37 >> (0x17U - (char)lVar42 & 0x1f) &
                                           stbi__bmask[lVar40 + 10]) +
                                           piVar9[lVar39 * 0x1a4 + lVar42], uVar44 < 0x100)) {
                                bVar10 = z->huff_ac[lVar39].size[uVar44];
                                if ((uVar37 >> (-bVar10 & 0x1f) & stbi__bmask[bVar10]) !=
                                    (uint)z->huff_ac[lVar39].code[uVar44]) {
LAB_0045c8b2:
                                  __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image.h"
                                                ,0x85c,
                                                "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                               );
                                }
                                z->code_bits = (iVar30 - (int)lVar42) + -9;
                                z->code_buffer = uVar37 << ((byte)(lVar40 + 10) & 0x1f);
                                uVar29 = (uint)z->huff_ac[lVar39].values[uVar44];
                              }
                            }
                          }
                          else {
                            bVar10 = z->huff_ac[lVar39].size[uVar36];
                            uVar29 = 0xffffffff;
                            if ((int)(uint)bVar10 <= z->code_bits) {
                              z->code_buffer = uVar37 << (bVar10 & 0x1f);
                              z->code_bits = z->code_bits - (uint)bVar10;
                              uVar29 = (uint)z->huff_ac[lVar39].values[uVar36];
                            }
                          }
                          if ((int)uVar29 < 0) {
                            *puVar25 = "bad huffman code";
                            bVar46 = false;
                          }
                          else {
                            uVar37 = uVar29 >> 4;
                            if ((uVar29 & 0xf) == 1) {
                              if (z->code_bits < 1) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              uVar29 = -uVar19;
                              if (0 < z->code_bits) {
                                sVar14 = z->code_buffer;
                                z->code_buffer = sVar14 * 2;
                                z->code_bits = z->code_bits + -1;
                                if ((int)sVar14 < 0) {
                                  uVar29 = uVar19;
                                }
                              }
                              local_1c0 = (ulong)uVar29;
                              uVar44 = uVar37;
                            }
                            else {
                              if ((uVar29 & 0xf) != 0) {
                                *puVar25 = "bad huffman code";
                                bVar46 = false;
                                goto LAB_0045b4f0;
                              }
                              local_1c0 = 0;
                              uVar44 = 0xf;
                              if (uVar29 < 0xf0) {
                                z->eob_run = ~(-1 << ((byte)uVar37 & 0x1f));
                                uVar44 = 0x40;
                                if (0xf < uVar29) {
                                  if (z->code_bits < (int)uVar37) {
                                    stbi__grow_buffer_unsafe(z);
                                  }
                                  local_1c0 = 0;
                                  uVar29 = 0;
                                  if ((int)uVar37 <= z->code_bits) {
                                    bVar10 = (byte)uVar37 & 0x1f;
                                    uVar29 = z->code_buffer << bVar10 |
                                             z->code_buffer >> 0x20 - bVar10;
                                    uVar5 = stbi__bmask[uVar37];
                                    z->code_buffer = ~uVar5 & uVar29;
                                    uVar29 = uVar29 & uVar5;
                                    z->code_bits = z->code_bits - uVar37;
                                  }
                                  z->eob_run = z->eob_run + uVar29;
                                }
                              }
                            }
                            uVar38 = (ulong)(int)uVar38;
                            do {
                              if ((long)z->spec_end < (long)uVar38) break;
                              bVar10 = ""[uVar38];
                              if (psVar45[bVar10] == 0) {
                                if (uVar44 == 0) {
                                  psVar45[bVar10] = (short)local_1c0;
                                  bVar46 = false;
                                  uVar44 = 0;
                                }
                                else {
                                  uVar44 = uVar44 - 1;
                                  bVar46 = true;
                                }
                              }
                              else {
                                if (z->code_bits < 1) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                bVar46 = true;
                                if (0 < z->code_bits) {
                                  sVar14 = z->code_buffer;
                                  z->code_buffer = sVar14 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  if (((int)sVar14 < 0) &&
                                     (sVar4 = psVar45[bVar10], (uVar19 & (int)sVar4) == 0)) {
                                    sVar7 = (short)((uint)iVar16 >> 0x10);
                                    if (sVar4 < 1) {
                                      sVar7 = -sVar7;
                                    }
                                    psVar45[bVar10] = sVar4 + sVar7;
                                  }
                                }
                              }
                              uVar38 = uVar38 + 1;
                            } while (bVar46);
                            bVar46 = true;
                          }
LAB_0045b4f0:
                          if (!bVar46) {
                            uVar36 = 0;
                            goto LAB_0045b50a;
                          }
                        } while ((int)uVar38 <= z->spec_end);
                      }
                      else {
                        z->eob_run = iVar16 + -1;
                        if (z->spec_start <= z->spec_end) {
                          uVar19 = (0x10000 << (bVar10 & 0x1f)) >> 0x10;
                          do {
                            bVar10 = ""[uVar38];
                            if (psVar45[bVar10] != 0) {
                              if (z->code_bits < 1) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              if (0 < z->code_bits) {
                                sVar14 = z->code_buffer;
                                z->code_buffer = sVar14 * 2;
                                z->code_bits = z->code_bits + -1;
                                if (((int)sVar14 < 0) &&
                                   (sVar4 = psVar45[bVar10], (uVar19 & (int)sVar4) == 0)) {
                                  uVar37 = -uVar19;
                                  if (0 < sVar4) {
                                    uVar37 = uVar19;
                                  }
                                  psVar45[bVar10] = (short)uVar37 + sVar4;
                                }
                              }
                            }
                            bVar46 = (long)uVar38 < (long)z->spec_end;
                            uVar38 = uVar38 + 1;
                          } while (bVar46);
                        }
                      }
LAB_0045b505:
                      uVar36 = 1;
                    }
LAB_0045b50a:
                    if ((int)uVar36 == 0) {
                      bVar46 = false;
                      local_1b4 = 0;
                    }
                    else {
LAB_0045b52f:
                      iVar16 = z->todo;
                      z->todo = iVar16 + -1;
                      bVar46 = true;
                      if (iVar16 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar36 = extraout_RDX_06;
                        }
                        if ((z->marker & 0xf8) == 0xd0) {
                          z->code_buffer = 0;
                          z->code_bits = 0;
                          z->nomore = 0;
                          z->img_comp[3].dc_pred = 0;
                          z->img_comp[2].dc_pred = 0;
                          z->img_comp[1].dc_pred = 0;
                          z->img_comp[0].dc_pred = 0;
                          z->marker = 0xff;
                          iVar16 = z->restart_interval;
                          uVar36 = 0x7fffffff;
                          if (iVar16 == 0) {
                            iVar16 = 0x7fffffff;
                          }
                          z->todo = iVar16;
                          z->eob_run = 0;
                        }
                        else {
                          local_1b4 = 1;
                          bVar46 = false;
                        }
                      }
                    }
                  }
                  uVar19 = (uint)uVar36;
                  if (!bVar46) {
                    uVar38 = (ulong)local_1b4;
                    goto LAB_0045bfa9;
                  }
                  iVar26 = iVar26 + 1;
                } while (iVar26 != iVar15);
              }
              uVar19 = (uint)uVar36;
              uVar38 = 1;
              iVar18 = iVar18 + 1;
            } while (iVar18 != iVar13);
          }
        }
        else {
          uVar38 = 1;
          if (0 < z->img_mcu_y) {
            iVar13 = 0;
            do {
              if (0 < z->img_mcu_x) {
                iVar18 = 0;
                do {
                  if (0 < z->scan_n) {
                    uVar38 = 0;
                    do {
                      local_1c0 = uVar38;
                      iVar15 = z->order[local_1c0];
                      if (0 < z->img_comp[iVar15].v) {
                        iVar26 = 0;
                        bVar46 = true;
                        do {
                          iVar16 = paVar1[iVar15].h;
                          if (0 < iVar16) {
                            iVar30 = 0;
                            do {
                              iVar16 = stbi__jpeg_decode_block_prog_dc
                                                 (z,paVar1[iVar15].coeff +
                                                    (iVar16 * iVar18 + iVar30 +
                                                    (paVar1[iVar15].v * iVar13 + iVar26) *
                                                    paVar1[iVar15].coeff_w) * 0x40,
                                                  z->huff_dc + paVar1[iVar15].hd,iVar15);
                              uVar19 = (uint)extraout_RDX_10;
                              uVar36 = extraout_RDX_10;
                              if (iVar16 == 0) {
                                if (bVar46) goto LAB_0045bf7f;
                                goto LAB_0045bc5d;
                              }
                              iVar30 = iVar30 + 1;
                              iVar16 = paVar1[iVar15].h;
                            } while (iVar30 < iVar16);
                          }
                          iVar26 = iVar26 + 1;
                          bVar46 = iVar26 < paVar1[iVar15].v;
                        } while (iVar26 < paVar1[iVar15].v);
                      }
LAB_0045bc5d:
                      uVar38 = local_1c0 + 1;
                    } while ((long)(local_1c0 + 1) < (long)z->scan_n);
                  }
                  uVar19 = (uint)uVar36;
                  iVar15 = z->todo;
                  z->todo = iVar15 + -1;
                  if (iVar15 < 2) {
                    if (z->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(z);
                      uVar19 = extraout_EDX_01;
                    }
                    if ((z->marker & 0xf8) != 0xd0) goto LAB_0045bd32;
                    z->code_buffer = 0;
                    z->code_bits = 0;
                    z->nomore = 0;
                    z->img_comp[3].dc_pred = 0;
                    z->img_comp[2].dc_pred = 0;
                    z->img_comp[1].dc_pred = 0;
                    z->img_comp[0].dc_pred = 0;
                    z->marker = 0xff;
                    iVar15 = z->restart_interval;
                    uVar36 = 0x7fffffff;
                    if (iVar15 == 0) {
                      iVar15 = 0x7fffffff;
                    }
                    z->todo = iVar15;
                    z->eob_run = 0;
                  }
                  iVar18 = iVar18 + 1;
                } while (iVar18 < z->img_mcu_x);
              }
              uVar19 = (uint)uVar36;
              iVar13 = iVar13 + 1;
            } while (iVar13 < z->img_mcu_y);
LAB_0045bd32:
            uVar38 = 1;
          }
        }
        goto LAB_0045bfa9;
      }
      pcVar27 = "bad SOS component count";
LAB_0045c7fa:
      uVar19 = (uint)paVar32;
      *puVar25 = pcVar27;
      goto LAB_0045c802;
    }
    if (uVar37 == 0xdc) {
      iVar13 = stbi__get16be(z->s);
      sVar14 = stbi__get16be(z->s);
      if (iVar13 == 4) {
        if (sVar14 != z->s->img_y) {
          pcVar27 = "bad DNL height";
          goto LAB_0045aae3;
        }
        bVar10 = stbi__get_marker(z);
        uVar37 = (uint)bVar10;
        bVar46 = true;
        uVar31 = extraout_RDX_02;
      }
      else {
        pcVar27 = "bad DNL len";
LAB_0045aae3:
        *puVar25 = pcVar27;
        uVar37 = 0xdc;
        bVar46 = false;
        uVar31 = extraout_RDX_01;
      }
      uVar19 = (uint)uVar31;
      if (!bVar46) goto LAB_0045c802;
      goto LAB_0045a9ed;
    }
    if (uVar37 == 0xd9) {
      if ((z->progressive != 0) && (0 < z->s->img_n)) {
        lVar20 = 0;
        do {
          iVar13 = z->img_comp[lVar20].y + 7 >> 3;
          if (0 < iVar13) {
            uVar19 = paVar1[lVar20].x + 7 >> 3;
            iVar18 = 0;
            do {
              if (0 < (int)uVar19) {
                uVar36 = 0;
                do {
                  psVar45 = paVar1[lVar20].coeff +
                            (paVar1[lVar20].coeff_w * iVar18 + (int)uVar36) * 0x40;
                  iVar15 = paVar1[lVar20].tq;
                  lVar39 = 0;
                  do {
                    psVar45[lVar39] = psVar45[lVar39] * z->dequant[iVar15][lVar39];
                    lVar39 = lVar39 + 1;
                  } while (lVar39 != 0x40);
                  (*z->idct_block_kernel)
                            (paVar1[lVar20].data +
                             uVar36 * 8 + (long)(iVar18 * 8 * paVar1[lVar20].w2),paVar1[lVar20].w2,
                             psVar45);
                  uVar36 = uVar36 + 1;
                  uVar31 = extraout_RDX_14;
                } while (uVar36 != uVar19);
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 != iVar13);
          }
          uVar19 = (uint)uVar31;
          lVar20 = lVar20 + 1;
        } while (lVar20 < z->s->img_n);
      }
    }
    else {
      iVar13 = stbi__process_marker(z,uVar37);
      uVar19 = extraout_EDX_00;
      if (iVar13 != 0) goto LAB_0045aa1b;
    }
    uVar37 = z->s->img_n;
    if ((ulong)uVar37 == 3) {
      bVar46 = true;
      if (z->rgb != 3) {
        if (z->app14_color_transform != 0) goto LAB_0045c30c;
        bVar46 = z->jfif == 0;
      }
    }
    else {
LAB_0045c30c:
      bVar46 = false;
    }
    if ((int)uVar37 < 1) goto LAB_0045c80c;
    local_148[2] = (stbi_uc *)0x0;
    lStack_130 = 0;
    local_148[0] = (stbi_uc *)0x0;
    local_148[1] = (stbi_uc *)0x0;
    lVar20 = (ulong)uVar37 * 0x30;
    pvVar24 = (void *)0x0;
    lVar39 = 0;
    do {
      psVar34 = z->s;
      sVar14 = psVar34->img_x;
      pvVar22 = malloc((ulong)(sVar14 + 3));
      *(void **)((long)&z->img_comp[0].linebuf + lVar39 * 2) = pvVar22;
      if (pvVar22 == (void *)0x0) {
        stbi__free_jpeg_components(z,psVar34->img_n,why);
        *puVar25 = "outofmem";
      }
      else {
        uVar36 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar39 * 2);
        iVar13 = (int)uVar36;
        *(int *)((long)local_e0 + lVar39) = iVar13;
        iVar18 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar39 * 2);
        *(int *)((long)local_e0 + lVar39 + 4) = iVar18;
        *(int *)((long)local_e0 + lVar39 + 0xc) = iVar18 >> 1;
        *(int *)((long)local_e0 + lVar39 + 8) =
             (int)((ulong)((sVar14 + iVar13) - 1) / (uVar36 & 0xffffffff));
        *(undefined4 *)((long)local_e0 + lVar39 + 0x10) = 0;
        uVar31 = *(undefined8 *)((long)&z->img_comp[0].data + lVar39 * 2);
        *(undefined8 *)((long)local_f0 + lVar39 + 8) = uVar31;
        *(undefined8 *)((long)local_f0 + lVar39) = uVar31;
        if ((iVar13 == 1) && (iVar18 == 1)) {
          pcVar23 = resample_row_1;
        }
        else if ((iVar13 == 1) && (iVar18 == 2)) {
          pcVar23 = stbi__resample_row_v_2;
        }
        else if ((iVar13 == 2) && (iVar18 == 1)) {
          pcVar23 = stbi__resample_row_h_2;
        }
        else if ((iVar13 == 2) && (iVar18 == 2)) {
          pcVar23 = z->resample_row_hv_2_kernel;
        }
        else {
          pcVar23 = stbi__resample_row_generic;
        }
        *(code **)((long)local_f8 + lVar39) = pcVar23;
      }
      if (pvVar22 == (void *)0x0) goto LAB_0045c814;
      lVar39 = lVar39 + 0x30;
    } while (lVar20 != lVar39);
    psVar34 = z->s;
    sVar14 = psVar34->img_y;
    pvVar24 = stbi__malloc_mad3(4,psVar34->img_x,sVar14,1);
    if (pvVar24 != (void *)0x0) {
      iVar13 = why_00;
      if (sVar14 != 0) {
        iVar18 = 0;
        uVar19 = 0;
        do {
          sVar14 = psVar34->img_x;
          ppsVar35 = local_148;
          lVar39 = 0;
          do {
            puVar25 = (undefined8 *)((long)local_f0 + lVar39 + 8);
            iVar13 = *(int *)((long)local_e0 + lVar39 + 0xc);
            iVar15 = *(int *)((long)local_e0 + lVar39 + 4);
            iVar26 = iVar15 >> 1;
            puVar28 = puVar25;
            if (iVar13 < iVar26) {
              puVar28 = (undefined8 *)((long)local_f0 + lVar39);
            }
            if (iVar26 <= iVar13) {
              puVar25 = (undefined8 *)((long)local_f0 + lVar39);
            }
            auVar47 = (**(code **)((long)local_f8 + lVar39))
                                (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar39 * 2),
                                 *puVar28,*puVar25,*(undefined4 *)((long)local_e0 + lVar39 + 8),
                                 *(undefined4 *)((long)local_e0 + lVar39));
            psVar33 = auVar47._8_8_;
            *ppsVar35 = auVar47._0_8_;
            *(int *)((long)local_e0 + lVar39 + 0xc) = iVar13 + 1;
            if (iVar15 <= iVar13 + 1) {
              *(undefined4 *)((long)local_e0 + lVar39 + 0xc) = 0;
              lVar42 = *(long *)((long)local_f0 + lVar39 + 8);
              *(long *)((long)local_f0 + lVar39) = lVar42;
              iVar13 = *(int *)((long)local_e0 + lVar39 + 0x10) + 1;
              *(int *)((long)local_e0 + lVar39 + 0x10) = iVar13;
              if (iVar13 < *(int *)((long)&z->img_comp[0].y + lVar39 * 2)) {
                *(long *)((long)local_f0 + lVar39 + 8) =
                     lVar42 + *(int *)((long)&z->img_comp[0].w2 + lVar39 * 2);
              }
            }
            lVar39 = lVar39 + 0x30;
            ppsVar35 = ppsVar35 + 1;
          } while (lVar20 != lVar39);
          psVar41 = (stbi_uc *)((ulong)(uVar19 * sVar14 * 4) + (long)pvVar24);
          psVar34 = z->s;
          if (psVar34->img_n == 3) {
            if (bVar46) {
              if (psVar34->img_x != 0) {
                uVar37 = sVar14 * iVar18;
                uVar36 = 0;
                do {
                  *(stbi_uc *)((long)pvVar24 + uVar36 * 4 + (ulong)uVar37) = local_148[0][uVar36];
                  *(stbi_uc *)((long)pvVar24 + uVar36 * 4 + (ulong)uVar37 + 1) =
                       local_148[1][uVar36];
                  *(stbi_uc *)((long)pvVar24 + uVar36 * 4 + (ulong)uVar37 + 2) =
                       local_148[2][uVar36];
                  *(undefined1 *)((long)pvVar24 + uVar36 * 4 + (ulong)uVar37 + 3) = 0xff;
                  uVar36 = uVar36 + 1;
                  psVar33 = local_148[2];
                } while (uVar36 < psVar34->img_x);
              }
            }
            else {
LAB_0045c703:
              (*z->YCbCr_to_RGB_kernel)
                        (psVar41,local_148[0],local_148[1],local_148[2],psVar34->img_x,4);
              psVar33 = extraout_RDX_15;
            }
          }
          else if (psVar34->img_n == 4) {
            if (z->app14_color_transform == 2) {
              (*z->YCbCr_to_RGB_kernel)
                        (psVar41,local_148[0],local_148[1],local_148[2],psVar34->img_x,4);
              psVar34 = z->s;
              psVar33 = extraout_RDX_16;
              if (psVar34->img_x != 0) {
                uVar37 = sVar14 * iVar18;
                psVar33 = (stbi_uc *)0x0;
                do {
                  bVar10 = psVar33[lStack_130];
                  iVar13 = (*(byte *)((long)pvVar24 + (long)psVar33 * 4 + (ulong)uVar37) ^ 0xff) *
                           (uint)bVar10;
                  *(char *)((long)pvVar24 + (long)psVar33 * 4 + (ulong)uVar37) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  iVar13 = (*(byte *)((long)pvVar24 + (long)psVar33 * 4 + (ulong)uVar37 + 1) ^ 0xff)
                           * (uint)bVar10;
                  *(char *)((long)pvVar24 + (long)psVar33 * 4 + (ulong)uVar37 + 1) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  iVar13 = (*(byte *)((long)pvVar24 + (long)psVar33 * 4 + (ulong)uVar37 + 2) ^ 0xff)
                           * (uint)bVar10;
                  *(char *)((long)pvVar24 + (long)psVar33 * 4 + (ulong)uVar37 + 2) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  psVar33 = psVar33 + 1;
                } while (psVar33 < (stbi_uc *)(ulong)psVar34->img_x);
              }
            }
            else {
              if (z->app14_color_transform != 0) goto LAB_0045c703;
              if (psVar34->img_x != 0) {
                uVar37 = sVar14 * iVar18;
                uVar36 = 0;
                do {
                  bVar10 = *(byte *)(lStack_130 + uVar36);
                  iVar13 = (uint)local_148[0][uVar36] * (uint)bVar10;
                  *(char *)((long)pvVar24 + uVar36 * 4 + (ulong)uVar37) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  iVar13 = (uint)local_148[1][uVar36] * (uint)bVar10;
                  *(char *)((long)pvVar24 + uVar36 * 4 + (ulong)uVar37 + 1) =
                       (char)(iVar13 + (iVar13 + 0x80U >> 8) + 0x80 >> 8);
                  *(char *)((long)pvVar24 + uVar36 * 4 + (ulong)uVar37 + 2) =
                       (char)((uint)local_148[2][uVar36] * (uint)bVar10 +
                              ((uint)local_148[2][uVar36] * (uint)bVar10 + 0x80 >> 8) + 0x80 >> 8);
                  *(undefined1 *)((long)pvVar24 + uVar36 * 4 + (ulong)uVar37 + 3) = 0xff;
                  uVar36 = uVar36 + 1;
                  psVar33 = local_148[1];
                } while (uVar36 < psVar34->img_x);
              }
            }
          }
          else if (psVar34->img_x != 0) {
            uVar36 = (ulong)(sVar14 * iVar18);
            psVar41 = (stbi_uc *)0x0;
            do {
              sVar3 = local_148[0][(long)psVar41];
              *(stbi_uc *)((long)pvVar24 + (long)psVar41 * 4 + uVar36 + 2) = sVar3;
              *(stbi_uc *)((long)pvVar24 + (long)psVar41 * 4 + uVar36 + 1) = sVar3;
              *(stbi_uc *)((long)pvVar24 + (long)psVar41 * 4 + uVar36) = sVar3;
              *(undefined1 *)((long)pvVar24 + (long)psVar41 * 4 + uVar36 + 3) = 0xff;
              psVar41 = psVar41 + 1;
              psVar33 = (stbi_uc *)(ulong)psVar34->img_x;
            } while (psVar41 < psVar33);
          }
          iVar13 = (int)psVar33;
          uVar19 = uVar19 + 1;
          psVar34 = z->s;
          iVar18 = iVar18 + 4;
        } while (uVar19 < psVar34->img_y);
      }
      stbi__free_jpeg_components(z,psVar34->img_n,iVar13);
      psVar34 = z->s;
      *local_118 = psVar34->img_x;
      *local_110 = psVar34->img_y;
      if (local_108 != (int *)0x0) {
        *local_108 = (uint)(2 < psVar34->img_n) * 2 + 1;
      }
      goto LAB_0045c814;
    }
    stbi__free_jpeg_components(z,psVar34->img_n,why_00);
    *puVar25 = "outofmem";
  }
  pvVar24 = (void *)0x0;
LAB_0045c814:
  free(z);
  return pvVar24;
LAB_0045bf7f:
  uVar38 = 0;
LAB_0045bfa9:
  if ((int)uVar38 == 0) goto LAB_0045c802;
  if (z->marker == 0xff) {
    do {
      psVar34 = z->s;
      if ((psVar34->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0045bfdf:
        if (psVar34->img_buffer_end <= psVar34->img_buffer) {
LAB_0045c17a:
          uVar12 = 0xff;
          break;
        }
      }
      else {
        iVar13 = (*(psVar34->io).eof)(psVar34->io_user_data);
        if (iVar13 != 0) {
          if (psVar34->read_from_callbacks != 0) goto LAB_0045bfdf;
          goto LAB_0045c17a;
        }
      }
      psVar34 = z->s;
      pbVar21 = psVar34->img_buffer;
      if (pbVar21 < psVar34->img_buffer_end) {
LAB_0045c079:
        psVar34->img_buffer = pbVar21 + 1;
        uVar36 = (ulong)*pbVar21;
      }
      else {
        if (psVar34->read_from_callbacks != 0) {
          psVar33 = psVar34->buffer_start;
          iVar13 = (*(psVar34->io).read)(psVar34->io_user_data,(char *)psVar33,psVar34->buflen);
          psVar34->callback_already_read =
               psVar34->callback_already_read +
               (*(int *)&psVar34->img_buffer - *(int *)&psVar34->img_buffer_original);
          if (iVar13 == 0) {
            psVar34->read_from_callbacks = 0;
            psVar34->img_buffer = psVar33;
            psVar34->img_buffer_end = psVar34->buffer_start + 1;
            psVar34->buffer_start[0] = '\0';
          }
          else {
            psVar34->img_buffer = psVar33;
            psVar34->img_buffer_end = psVar33 + iVar13;
          }
          pbVar21 = psVar34->img_buffer;
          goto LAB_0045c079;
        }
        uVar36 = 0;
      }
      do {
        cVar11 = (char)uVar36;
        uVar36 = uVar38;
        if (cVar11 != -1) break;
        psVar34 = z->s;
        if ((psVar34->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0045c0b1:
          if (psVar34->img_buffer_end <= psVar34->img_buffer) {
LAB_0045c166:
            uVar36 = 0xff;
            break;
          }
        }
        else {
          iVar13 = (*(psVar34->io).eof)(psVar34->io_user_data);
          if (iVar13 != 0) {
            if (psVar34->read_from_callbacks != 0) goto LAB_0045c0b1;
            goto LAB_0045c166;
          }
        }
        psVar34 = z->s;
        pbVar21 = psVar34->img_buffer;
        if (pbVar21 < psVar34->img_buffer_end) {
LAB_0045c14b:
          psVar34->img_buffer = pbVar21 + 1;
          uVar36 = (ulong)*pbVar21;
        }
        else {
          if (psVar34->read_from_callbacks != 0) {
            psVar33 = psVar34->buffer_start;
            iVar13 = (*(psVar34->io).read)(psVar34->io_user_data,(char *)psVar33,psVar34->buflen);
            psVar34->callback_already_read =
                 psVar34->callback_already_read +
                 (*(int *)&psVar34->img_buffer - *(int *)&psVar34->img_buffer_original);
            if (iVar13 == 0) {
              psVar34->read_from_callbacks = 0;
              psVar34->img_buffer = psVar33;
              psVar34->img_buffer_end = psVar34->buffer_start + 1;
              psVar34->buffer_start[0] = '\0';
            }
            else {
              psVar34->img_buffer = psVar33;
              psVar34->img_buffer_end = psVar33 + iVar13;
            }
            pbVar21 = psVar34->img_buffer;
            goto LAB_0045c14b;
          }
          uVar36 = 0;
        }
      } while (0xfd < (byte)((char)uVar36 - 1U));
      uVar12 = (uchar)uVar36;
      uVar38 = uVar36;
    } while (cVar11 != -1);
    z->marker = uVar12;
  }
  bVar10 = stbi__get_marker(z);
  uVar37 = (uint)bVar10;
  uVar31 = extraout_RDX_13;
  if ((bVar10 & 0xf8) == 0xd0) {
LAB_0045aa1b:
    bVar10 = stbi__get_marker(z);
    uVar37 = (uint)bVar10;
    uVar31 = extraout_RDX_00;
  }
  goto LAB_0045a9ed;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}